

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

string * __thiscall Tracker::logAverage(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  ulong *puVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double delta;
  double average;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string track_name;
  double local_1b0;
  double local_1a8;
  ulong *local_1a0;
  long local_198;
  ulong local_190 [2];
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined8 uStack_168;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  double local_38;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
          ::find(&(this->m_data)._M_t,_track);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    return __return_storage_ptr__;
  }
  local_120 = &__return_storage_ptr__->field_2;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,*(long *)(iVar1._M_node + 1),
             (long)&(iVar1._M_node[1]._M_parent)->_M_color + *(long *)(iVar1._M_node + 1));
  local_1a8 = 0.0;
  local_1b0 = 0.0;
  p_Var2 = iVar1._M_node[3]._M_parent;
  lVar5 = ((long)iVar1._M_node[3]._M_left - (long)p_Var2 >> 3) * -0x5555555555555555;
  if (iVar1._M_node[3]._M_left != p_Var2) {
    dVar11 = 0.0;
    local_1a8 = 0.0;
    lVar8 = 0;
    do {
      local_1a8 = local_1a8 + (double)p_Var2->_M_left;
      if (lVar8 != 0) {
        dVar11 = dVar11 + (*(double *)p_Var2 - (double)p_Var2[-1]._M_parent);
        local_1b0 = dVar11;
      }
      lVar8 = lVar8 + 1;
      p_Var2 = (_Base_ptr)&p_Var2->_M_right;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
  }
  auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  local_1a8 = local_1a8 / dVar11;
  local_1b0 = local_1b0 / (dVar11 + -1.0);
  *(double *)(iVar1._M_node + 4) = local_1a8;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,local_58,local_50 + (long)local_58)
  ;
  std::__cxx11::string::append((char *)&local_1a0);
  vera::toString<double>(&local_98,&local_1a8);
  uVar9 = 0xf;
  if (local_1a0 != local_190) {
    uVar9 = local_190[0];
  }
  if (uVar9 < local_98._M_string_length + local_198) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar10 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_98._M_string_length + local_198) goto LAB_001fd375;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_1a0);
  }
  else {
LAB_001fd375:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_98._M_dataplus._M_p);
  }
  local_180 = &local_170;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_170 = *plVar4;
    uStack_168 = puVar3[3];
  }
  else {
    local_170 = *plVar4;
    local_180 = (long *)*puVar3;
  }
  local_178 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_108 = *puVar6;
    lStack_100 = plVar4[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar6;
    local_118 = (ulong *)*plVar4;
  }
  local_110 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_38 = (local_1a8 / local_1b0) * 100.0;
  vera::toString<double>(&local_b8,&local_38);
  uVar9 = 0xf;
  if (local_118 != &local_108) {
    uVar9 = local_108;
  }
  if (uVar9 < local_b8._M_string_length + local_110) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar10 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_b8._M_string_length + local_110) goto LAB_001fd4c8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_118);
  }
  else {
LAB_001fd4c8:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
  }
  local_160 = &local_150;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_150 = *plVar4;
    uStack_148 = puVar3[3];
  }
  else {
    local_150 = *plVar4;
    local_160 = (long *)*puVar3;
  }
  local_158 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_e8 = *puVar6;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar6;
    local_f8 = (ulong *)*plVar4;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  vera::toString<double>(&local_d8,&local_1b0);
  uVar9 = 0xf;
  if (local_f8 != &local_e8) {
    uVar9 = local_e8;
  }
  if (uVar9 < local_d8._M_string_length + local_f0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar10 = local_d8.field_2._M_allocated_capacity;
    }
    if (local_d8._M_string_length + local_f0 <= (ulong)uVar10) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
      goto LAB_001fd62b;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8._M_dataplus._M_p);
LAB_001fd62b:
  local_140 = &local_130;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_130 = *plVar4;
    uStack_128 = puVar3[3];
  }
  else {
    local_130 = *plVar4;
    local_140 = (long *)*puVar3;
  }
  local_138 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_68 = *plVar7;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar7;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logAverage(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;

    double average = 0.0;
    double delta = 0.0;
    for (size_t i = 0; i < it->second.samples.size(); i++) {
        average += it->second.samples[i].durationMs;
        if (i > 0)
            delta += it->second.samples[i].startMs - it->second.samples[i-1].startMs;
    }

    average /= (double)it->second.samples.size();
    delta /= (double)it->second.samples.size() - 1.0;
    it->second.durationAverage = average;
    
    log += track_name + "," + vera::toString(average) + "," + vera::toString( (average/delta) * 100.0) + "," + vera::toString(delta) +  "\n";

    return log;
}